

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d.c
# Opt level: O2

int main(int ac,char **av)

{
  int iVar1;
  FILE *__stream;
  size_t __size;
  uint8_t *__ptr;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  int i;
  ulong uVar5;
  long lVar6;
  s98context context;
  
  if (ac == 2) {
    __stream = fopen(av[1],"rb");
    if (__stream == (FILE *)0x0) {
      perror(av[1]);
      iVar3 = -1;
    }
    else {
      context.ts.tv_nsec = 0;
      context.sync_count = 0;
      context.tag_or_title = (char *)0x0;
      context.ts.tv_sec = 0;
      context.header.device_count = 0;
      context._36_4_ = 0;
      context.devices = (s98deviceinfo *)0x0;
      context.header.offset_to_tag = 0;
      context.header.offset_to_dump = 0;
      context.header.offset_to_loop = 0;
      context.header.offset_to_compressed_data = 0;
      context.header.version = 0;
      context.header.timer_numerator = 0;
      context.header.timer_denominator = 0;
      context.header.compression = 0;
      iVar3 = 0;
      fseek(__stream,0,2);
      __size = ftell(__stream);
      context.s98_size = __size;
      __ptr = (uint8_t *)malloc(__size);
      context.s98_buffer = __ptr;
      rewind(__stream);
      fread(__ptr,1,__size,__stream);
      context.p = __ptr;
      fclose(__stream);
      iVar1 = read_header(&context);
      if (iVar1 == 0) {
        read_devices(&context);
        printf("; S98 File: %s\n",av[1]);
        printf("; Offset to tag: 0x%08x (0 if none)\n",context.header._16_8_ & 0xffffffff);
        printf("; Dump start: 0x%08x\n",(ulong)context.header._16_8_ >> 0x20);
        printf("; Loop start: 0x%08x (0 if non-looped)\n",context.header._24_8_ & 0xffffffff);
        printf("#version %d\n",context.header._0_8_ & 0xffffffff);
        printf("#timer %d/%d\n",(ulong)context.header._0_8_ >> 0x20,
               context.header._8_8_ & 0xffffffff);
        read_tag(&context);
        putchar(10);
        lVar6 = 8;
        for (uVar5 = 0; uVar5 < (context._32_8_ & 0xffffffff); uVar5 = uVar5 + 1) {
          uVar2 = (ulong)*(uint *)((long)context.devices + lVar6 + -8);
          if (uVar2 < 0xc) {
            pcVar4 = device_names[uVar2];
          }
          else {
            pcVar4 = (char *)0x0;
          }
          printf("#device %s %d $%02x\n",pcVar4,(ulong)*(uint *)((long)context.devices + lVar6 + -4)
                 ,(ulong)*(uint *)((long)&(context.devices)->device + lVar6));
          lVar6 = lVar6 + 0x10;
        }
        putchar(10);
        s98d_dump(&context);
        putchar(10);
      }
      free_context(&context);
    }
  }
  else {
    fprintf(_stderr,"Usage: %s filename.s98\n",*av);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int ac, char** av)
{
    struct s98context context;
    struct s98context* ctx = &context;
    struct s98header* h = &context.header;
    FILE* fp;

    if(ac != 2) {
        fprintf(stderr, "Usage: %s filename.s98\n", *av);
        return 1;
    }

    fp = fopen(*++av, "rb");
    if(fp == NULL) {
        perror(*av);
        return -1;
    }

    memset(ctx, 0, sizeof context);

    fseek(fp, 0, SEEK_END);
    ctx->s98_size = ftell(fp);
    ctx->s98_buffer = malloc(ctx->s98_size);

    rewind(fp);
    fread(ctx->s98_buffer, 1, ctx->s98_size, fp);
    set_offset(ctx, 0);
    fclose(fp);

    if(read_header(ctx) != 0)
        goto cleanup;
    read_devices(ctx);

    printf("; S98 File: %s\n", *av);
    printf("; Offset to tag: 0x%08x (0 if none)\n", h->offset_to_tag);
    printf("; Dump start: 0x%08x\n", h->offset_to_dump);
    printf("; Loop start: 0x%08x (0 if non-looped)\n", h->offset_to_loop);

    printf("#version %d\n", h->version);
    printf("#timer %d/%d\n", h->timer_numerator, h->timer_denominator);

    read_tag(ctx);

    putchar('\n');
    {
        int i;
        for(i = 0; i < h->device_count; i++) {
            struct s98deviceinfo* info;
            info = ctx->devices + i;

            printf("#device %s %d $%02x\n", device_name(info->device), info->clock, info->panpot);
        }
    }

    putchar('\n');

    s98d_dump(ctx);

    putchar('\n');


cleanup:
    free_context(&context);

    return 0;
}